

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ReturnStmt * __thiscall parser::Parser::parseReturnStatement(Parser *this)

{
  ReturnStmt *this_00;
  Expr *pEVar1;
  Token local_40;
  
  this_00 = (ReturnStmt *)operator_new(0x48);
  token::Token::Token(&local_40,&this->curToken);
  ast::ReturnStmt::ReturnStmt(this_00,&local_40,this->l->line);
  token::Token::~Token(&local_40);
  nextToken(this);
  pEVar1 = parseExpression(this);
  this_00->returnValue = pEVar1;
  return this_00;
}

Assistant:

ReturnStmt* Parser::parseReturnStatement()
{
    ReturnStmt* stmt = new ReturnStmt(curToken, l->line);
    nextToken();
    stmt->returnValue = parseExpression();
    return stmt;
}